

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdt.cpp
# Opt level: O0

void __thiscall CDT::~CDT(CDT *this)

{
  CDT *this_local;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->m_cdt_indices);
  Info::~Info(&this->m_info);
  Activation::~Activation(&this->m_function);
  Matrix<double>::~Matrix(&this->m_output);
  Matrix<double>::~Matrix(&this->m_input);
  std::vector<Layer,_std::allocator<Layer>_>::~vector(&this->m_layers);
  DataSet::~DataSet(&this->m_dataset);
  return;
}

Assistant:

CDT::~CDT(){}